

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O0

int __thiscall
QAbstractScrollAreaScrollBarContainer::scrollBarLayoutIndex
          (QAbstractScrollAreaScrollBarContainer *this)

{
  int iVar1;
  long *plVar2;
  QScrollBar *pQVar3;
  long in_RDI;
  int i;
  int layoutItemCount;
  int local_18;
  
  iVar1 = (**(code **)(**(long **)(in_RDI + 0x30) + 200))();
  local_18 = 0;
  while( true ) {
    if (iVar1 <= local_18) {
      return -1;
    }
    plVar2 = (long *)(**(code **)(**(long **)(in_RDI + 0x30) + 0xa8))
                               (*(long **)(in_RDI + 0x30),local_18);
    (**(code **)(*plVar2 + 0x68))();
    pQVar3 = qobject_cast<QScrollBar*>((QObject *)0x495081);
    if (pQVar3 != (QScrollBar *)0x0) break;
    local_18 = local_18 + 1;
  }
  return local_18;
}

Assistant:

int QAbstractScrollAreaScrollBarContainer::scrollBarLayoutIndex() const
{
    const int layoutItemCount = layout->count();
    for (int i = 0; i < layoutItemCount; ++i) {
        if (qobject_cast<QScrollBar *>(layout->itemAt(i)->widget()))
            return i;
    }
    return -1;
}